

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O0

bool __thiscall
BlockFilterIndex::LookupFilterHeader
          (BlockFilterIndex *this,CBlockIndex *block_index,uint256 *header_out)

{
  long lVar1;
  bool bVar2;
  pointer ppVar3;
  CDBWrapper *db;
  size_type sVar4;
  unordered_map<uint256,_uint256,_FilterHeaderHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_uint256>_>_>
  *this_00;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  bool is_checkpoint;
  iterator header;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  DBVal entry;
  DBVal *in_stack_fffffffffffffeb8;
  unordered_map<uint256,_uint256,_FilterHeaderHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_uint256>_>_>
  *in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  uint256 *in_stack_fffffffffffffed0;
  DBVal *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  char *in_stack_fffffffffffffee8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffef0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffef8;
  bool local_c1;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffeb8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffed8 >> 0x18,0));
  bVar5 = *(int *)(in_RSI + 0x18) % 1000 == 0;
  if (bVar5) {
    CBlockIndex::GetBlockHash
              ((CBlockIndex *)
               CONCAT17(in_stack_fffffffffffffecf,
                        CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
    std::
    unordered_map<uint256,_uint256,_FilterHeaderHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_uint256>_>_>
    ::find(in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->hash);
    std::
    unordered_map<uint256,_uint256,_FilterHeaderHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_uint256>_>_>
    ::end(in_stack_fffffffffffffec0);
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_uint256,_uint256>,_true> *)
                       CONCAT17(in_stack_fffffffffffffecf,
                                CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)),
                       (_Node_iterator_base<std::pair<const_uint256,_uint256>,_true> *)
                       in_stack_fffffffffffffec0);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      ppVar3 = std::__detail::_Node_iterator<std::pair<const_uint256,_uint256>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_uint256,_uint256>,_false,_true> *)
                          in_stack_fffffffffffffeb8);
      *in_RDX = *(undefined8 *)(ppVar3->second).super_base_blob<256U>.m_data._M_elems;
      in_RDX[1] = *(undefined8 *)((ppVar3->second).super_base_blob<256U>.m_data._M_elems + 8);
      in_RDX[2] = *(undefined8 *)((ppVar3->second).super_base_blob<256U>.m_data._M_elems + 0x10);
      in_RDX[3] = *(undefined8 *)((ppVar3->second).super_base_blob<256U>.m_data._M_elems + 0x18);
      local_c1 = true;
      goto LAB_00924a46;
    }
  }
  anon_unknown.dwarf_ca4292::DBVal::DBVal(in_stack_fffffffffffffeb8);
  db = &std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator*
                  ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
                   CONCAT17(in_stack_fffffffffffffecf,
                            CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)))->
        super_CDBWrapper;
  bVar2 = LookupOne(db,(CBlockIndex *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                    in_stack_fffffffffffffed8);
  if (bVar2) {
    if ((bVar5) &&
       (sVar4 = std::
                unordered_map<uint256,_uint256,_FilterHeaderHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_uint256>_>_>
                ::size((unordered_map<uint256,_uint256,_FilterHeaderHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_uint256>_>_>
                        *)in_stack_fffffffffffffeb8), sVar4 < 2000)) {
      this_00 = (unordered_map<uint256,_uint256,_FilterHeaderHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_uint256>_>_>
                 *)(in_RDI + 0xf8);
      CBlockIndex::GetBlockHash
                ((CBlockIndex *)
                 CONCAT17(in_stack_fffffffffffffecf,
                          CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
      std::
      unordered_map<uint256,uint256,FilterHeaderHasher,std::equal_to<uint256>,std::allocator<std::pair<uint256_const,uint256>>>
      ::emplace<uint256,uint256&>
                (this_00,in_stack_fffffffffffffed0,
                 (uint256 *)
                 CONCAT17(in_stack_fffffffffffffecf,
                          CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
    }
    *in_RDX = local_50;
    in_RDX[1] = local_48;
    in_RDX[2] = local_40;
    in_RDX[3] = local_38;
    local_c1 = true;
  }
  else {
    local_c1 = false;
  }
LAB_00924a46:
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c1;
}

Assistant:

bool BlockFilterIndex::LookupFilterHeader(const CBlockIndex* block_index, uint256& header_out)
{
    LOCK(m_cs_headers_cache);

    bool is_checkpoint{block_index->nHeight % CFCHECKPT_INTERVAL == 0};

    if (is_checkpoint) {
        // Try to find the block in the headers cache if this is a checkpoint height.
        auto header = m_headers_cache.find(block_index->GetBlockHash());
        if (header != m_headers_cache.end()) {
            header_out = header->second;
            return true;
        }
    }

    DBVal entry;
    if (!LookupOne(*m_db, block_index, entry)) {
        return false;
    }

    if (is_checkpoint &&
        m_headers_cache.size() < CF_HEADERS_CACHE_MAX_SZ) {
        // Add to the headers cache if this is a checkpoint height.
        m_headers_cache.emplace(block_index->GetBlockHash(), entry.header);
    }

    header_out = entry.header;
    return true;
}